

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.h
# Opt level: O0

void __thiscall HighsLpRelaxation::setIterationLimit(HighsLpRelaxation *this,HighsInt limit)

{
  long in_RDI;
  string *option;
  Highs *in_stack_ffffffffffffffb8;
  undefined1 local_31 [49];
  
  option = (string *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_31 + 1),"simplex_iteration_limit",(allocator *)option);
  Highs::setOptionValue(in_stack_ffffffffffffffb8,option,(HighsInt)((ulong)(in_RDI + 8) >> 0x20));
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  return;
}

Assistant:

void setIterationLimit(HighsInt limit = kHighsIInf) {
    lpsolver.setOptionValue("simplex_iteration_limit", limit);
  }